

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_642426::CheckInferRaw(CScript *script)

{
  long lVar1;
  size_type sVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_1a0;
  char *local_198;
  lazy_ostream local_190;
  undefined1 *local_180;
  char **local_178;
  assertion_result local_170;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  FlatSigningProvider dummy_provider;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  dummy_provider.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_0114ae68;
  dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dummy_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dummy_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dummy_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dummy_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dummy_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  InferDescriptor((CScript *)local_138,(SigningProvider *)script);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x27;
  file.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  (**(code **)(*(long *)local_138 + 0x20))(local_138 + 8,local_138,0);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_138 + 8),"raw(",0);
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar2 == 0);
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178 = &local_1a0;
  local_1a0 = "desc->ToString().rfind(\"raw(\", 0) == 0";
  local_198 = "";
  local_190.m_empty = false;
  local_190._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_180 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_170,&local_190,1,0,WARN,0xb7c5f1,(size_t)&stack0xfffffffffffffe50,0x27);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  std::__cxx11::string::~string((string *)(local_138 + 8));
  if (local_138 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_138 + 8))();
  }
  FlatSigningProvider::~FlatSigningProvider(&dummy_provider);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckInferRaw(const CScript& script)
{
    FlatSigningProvider dummy_provider;
    std::unique_ptr<Descriptor> desc = InferDescriptor(script, dummy_provider);
    BOOST_CHECK(desc->ToString().rfind("raw(", 0) == 0);
}